

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * Json::StyledStreamWriter::normalizeEOL(string *__return_storage_ptr__,string *text)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcStack_48;
  char c;
  char *current;
  char *end;
  char *begin;
  string *text_local;
  string *normalized;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::length();
  pcStack_48 = pcVar1;
  while (pcStack_48 != pcVar1 + lVar2) {
    pcVar3 = pcStack_48 + 1;
    if (*pcStack_48 == '\r') {
      if (*pcVar3 == '\n') {
        pcVar3 = pcStack_48 + 2;
      }
      pcStack_48 = pcVar3;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcStack_48);
      pcStack_48 = pcVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StyledStreamWriter::normalizeEOL(const std::string& text) {
  std::string normalized;
  normalized.reserve(text.length());
  const char* begin = text.c_str();
  const char* end = begin + text.length();
  const char* current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') // mac or dos EOL
    {
      if (*current == '\n') // convert dos EOL
        ++current;
      normalized += '\n';
    } else // handle unix EOL & other char
      normalized += c;
  }
  return normalized;
}